

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O0

char * clib_resolve_lds(lua_State *L,char *name)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char *in_RSI;
  char buf [256];
  char *p;
  FILE *fp;
  char acStackY_128 [24];
  char *in_stack_fffffffffffffef0;
  lua_State *in_stack_fffffffffffffef8;
  char *local_20;
  
  __stream = fopen64(in_RSI,"r");
  local_20 = (char *)0x0;
  if (__stream != (FILE *)0x0) {
    pcVar2 = fgets(acStackY_128,0x100,__stream);
    if (pcVar2 != (char *)0x0) {
      iVar1 = strncmp(acStackY_128,"/* GNU ld script",0x10);
      if (iVar1 == 0) {
        do {
          pcVar2 = fgets(acStackY_128,0x100,__stream);
          if (pcVar2 == (char *)0x0) break;
          local_20 = clib_check_lds(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        } while (local_20 == (char *)0x0);
      }
      else {
        local_20 = clib_check_lds(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      }
    }
    fclose(__stream);
  }
  return local_20;
}

Assistant:

static const char *clib_resolve_lds(lua_State *L, const char *name)
{
  FILE *fp = fopen(name, "r");
  const char *p = NULL;
  if (fp) {
    char buf[256];
    if (fgets(buf, sizeof(buf), fp)) {
      if (!strncmp(buf, "/* GNU ld script", 16)) {  /* ld script magic? */
	while (fgets(buf, sizeof(buf), fp)) {  /* Check all lines. */
	  p = clib_check_lds(L, buf);
	  if (p) break;
	}
      } else {  /* Otherwise check only the first line. */
	p = clib_check_lds(L, buf);
      }
    }
    fclose(fp);
  }
  return p;
}